

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O1

void __thiscall
boost::detail::thread_data_base::notify_all_at_thread_exit
          (thread_data_base *this,condition_variable *cv,mutex *m)

{
  pointer *pppVar1;
  iterator __position;
  pair<boost::condition_variable_*,_boost::mutex_*> local_10;
  
  __position._M_current =
       (this->notify).
       super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->notify).
      super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.first = cv;
    local_10.second = m;
    std::
    vector<std::pair<boost::condition_variable*,boost::mutex*>,std::allocator<std::pair<boost::condition_variable*,boost::mutex*>>>
    ::_M_realloc_insert<std::pair<boost::condition_variable*,boost::mutex*>>
              ((vector<std::pair<boost::condition_variable*,boost::mutex*>,std::allocator<std::pair<boost::condition_variable*,boost::mutex*>>>
                *)&this->notify,__position,&local_10);
  }
  else {
    (__position._M_current)->first = cv;
    (__position._M_current)->second = m;
    pppVar1 = &(this->notify).
               super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

virtual void notify_all_at_thread_exit(condition_variable* cv, mutex* m)
            {
              notify.push_back(std::pair<condition_variable*, mutex*>(cv, m));
            }